

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArealObjectStatePdu.cpp
# Opt level: O3

void __thiscall
DIS::ArealObjectStatePdu::unmarshal(ArealObjectStatePdu *this,DataStream *dataStream)

{
  unsigned_short *d;
  pointer *ppVVar1;
  pointer pVVar2;
  pointer pVVar3;
  iterator __position;
  pointer pVVar4;
  ulong uVar5;
  Vector3Double x;
  Vector3Double local_50;
  
  SyntheticEnvironmentFamilyPdu::unmarshal(&this->super_SyntheticEnvironmentFamilyPdu,dataStream);
  EntityID::unmarshal(&this->_objectID,dataStream);
  EntityID::unmarshal(&this->_referencedObjectID,dataStream);
  DataStream::operator>>(dataStream,&this->_updateNumber);
  DataStream::operator>>(dataStream,&this->_forceID);
  DataStream::operator>>(dataStream,&this->_modifications);
  EntityType::unmarshal(&this->_objectType,dataStream);
  SixByteChunk::unmarshal(&this->_objectAppearance,dataStream);
  d = &this->_numberOfPoints;
  DataStream::operator>>(dataStream,d);
  SimulationAddress::unmarshal(&this->_requesterID,dataStream);
  SimulationAddress::unmarshal(&this->_receivingID,dataStream);
  pVVar2 = (this->_objectLocation).
           super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (this->_objectLocation).
           super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar4 = pVVar2;
  if (pVVar3 != pVVar2) {
    do {
      (**pVVar4->_vptr_Vector3Double)(pVVar4);
      pVVar4 = pVVar4 + 1;
    } while (pVVar4 != pVVar3);
    (this->_objectLocation).
    super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
  }
  if (*d != 0) {
    uVar5 = 0;
    do {
      Vector3Double::Vector3Double(&local_50);
      Vector3Double::unmarshal(&local_50,dataStream);
      __position._M_current =
           (this->_objectLocation).
           super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->_objectLocation).
          super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<DIS::Vector3Double,std::allocator<DIS::Vector3Double>>::
        _M_realloc_insert<DIS::Vector3Double_const&>
                  ((vector<DIS::Vector3Double,std::allocator<DIS::Vector3Double>> *)
                   &this->_objectLocation,__position,&local_50);
      }
      else {
        (__position._M_current)->_vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001a1778;
        (__position._M_current)->_x = local_50._x;
        (__position._M_current)->_y = local_50._y;
        (__position._M_current)->_z = local_50._z;
        ppVVar1 = &(this->_objectLocation).
                   super__Vector_base<DIS::Vector3Double,_std::allocator<DIS::Vector3Double>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppVVar1 = *ppVVar1 + 1;
      }
      Vector3Double::~Vector3Double(&local_50);
      uVar5 = uVar5 + 1;
    } while (uVar5 < *d);
  }
  return;
}

Assistant:

void ArealObjectStatePdu::unmarshal(DataStream& dataStream)
{
    SyntheticEnvironmentFamilyPdu::unmarshal(dataStream); // unmarshal information in superclass first
    _objectID.unmarshal(dataStream);
    _referencedObjectID.unmarshal(dataStream);
    dataStream >> _updateNumber;
    dataStream >> _forceID;
    dataStream >> _modifications;
    _objectType.unmarshal(dataStream);
    _objectAppearance.unmarshal(dataStream);
    dataStream >> _numberOfPoints;
    _requesterID.unmarshal(dataStream);
    _receivingID.unmarshal(dataStream);

     _objectLocation.clear();
     for(size_t idx = 0; idx < _numberOfPoints; idx++)
     {
        Vector3Double x;
        x.unmarshal(dataStream);
        _objectLocation.push_back(x);
     }
}